

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O2

void lookForBotCommands(Comment *comment)

{
  Reddit *pRVar1;
  bool bVar2;
  string_view substr;
  string_view substr_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  substr._M_str = "!std ignore_me";
  substr._M_len = 0xe;
  bVar2 = Comment::contains(comment,substr);
  if (bVar2) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&ignoredUsers_abi_cxx11_,&comment->author);
    saveData();
    pRVar1 = reddit;
    std::operator+(&local_40,"Alright, not following you anymore",&signature_abi_cxx11_);
    Reddit::comment((Reddit *)&local_70,(string *)pRVar1,&comment->fullName);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_70);
    std::__cxx11::string::~string((string *)&local_40);
  }
  substr_00._M_str = "!std follow_me";
  substr_00._M_len = 0xe;
  bVar2 = Comment::contains(comment,substr_00);
  if (bVar2) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&ignoredUsers_abi_cxx11_._M_t,&comment->author);
    saveData();
    pRVar1 = reddit;
    std::operator+(&local_60,"Happy to follow you again",&signature_abi_cxx11_);
    Reddit::comment((Reddit *)&local_80,(string *)pRVar1,&comment->fullName);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void lookForBotCommands(const Comment& comment) {
    if (comment.contains("!std ignore_me")) {
        ignoredUsers.insert(comment.author);
        saveData();
        reddit->comment(comment.fullName, "Alright, not following you anymore" + signature);
    }

    if (comment.contains("!std follow_me")) {
        ignoredUsers.erase(comment.author);
        saveData();
        reddit->comment(comment.fullName, "Happy to follow you again" + signature);
    }
}